

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O0

void MPIX_INAPrecv(void *buf,NAPComm *nap_comm,MPI_Datatype datatype,int tag,MPI_Comm comm,
                  NAPData *nap_data)

{
  NAPCommData *this;
  int in_ECX;
  MPI_Datatype in_RDX;
  long *in_RSI;
  void *in_RDI;
  undefined8 in_R8;
  long in_R9;
  int local_L_tag;
  char *local_L_buffer;
  char *global_recv_buffer;
  MPI_Request *L_recv_requests;
  MPI_Request *recv_requests;
  MPI_Request *global_recv_requests;
  NAPCommData *nap_recv_data;
  char **recv_buffer_ptr;
  MPI_Datatype mpi_type;
  MPI_Comm mpi_comm;
  int in_stack_ffffffffffffffbc;
  comm_pkg *in_stack_ffffffffffffffc0;
  
  this = (NAPCommData *)operator_new(0x28);
  NAPCommData::NAPCommData(this);
  *(undefined8 *)(in_R9 + 0x18) = in_R8;
  this->tag = in_ECX;
  this->buf = in_RDI;
  this->datatype = in_RDX;
  mpi_comm = (MPI_Comm)0x0;
  mpi_type = (MPI_Datatype)in_RSI[6];
  recv_buffer_ptr = (char **)0x0;
  MPIX_step_recv(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,(MPI_Comm)0x0,mpi_type,
                 (MPI_Request *)0x0,(char **)0x0);
  if (**(int **)(*in_RSI + 8) != 0) {
    MPIX_step_recv(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,mpi_comm,mpi_type,
                   (MPI_Request *)(mpi_type + (long)**(int **)(in_RSI[3] + 8) * 8),recv_buffer_ptr);
  }
  this->global_buffer = (char *)recv_buffer_ptr;
  this->local_L_buffer = (char *)0x0;
  *(NAPCommData **)(in_R9 + 8) = this;
  return;
}

Assistant:

static void MPIX_INAPrecv(void* buf, NAPComm* nap_comm,
        MPI_Datatype datatype, int tag,
        MPI_Comm comm, NAPData* nap_data)
{
    NAPCommData* nap_recv_data = new NAPCommData();
    nap_data->mpi_comm = comm;
    nap_recv_data->tag = tag;
    nap_recv_data->buf = buf;
    nap_recv_data->datatype = datatype;
    MPI_Request* global_recv_requests = NULL;
    MPI_Request* recv_requests = nap_comm->recv_requests;
    MPI_Request* L_recv_requests = NULL;
    char* global_recv_buffer = NULL;
    char* local_L_buffer = NULL;

    int local_L_tag = tag + 3;

    // Initialize Irecvs for inter-node step (step 2 in nap comm)
    MPIX_step_recv(nap_comm->global_comm, tag, comm, datatype,
            recv_requests, &global_recv_buffer);

    if (nap_comm->local_L_comm->recv_data->num_msgs)
    {
        L_recv_requests = &(recv_requests[nap_comm->global_comm->recv_data->num_msgs]);
        MPIX_step_recv(nap_comm->local_L_comm, local_L_tag, nap_comm->topo_info->local_comm,
                datatype, L_recv_requests, &local_L_buffer);
    }

    // Store global_recv_requests and global_recv_buffer, as to not free data
    // before recvs are finished
    nap_recv_data->global_buffer = global_recv_buffer;
    nap_recv_data->local_L_buffer = local_L_buffer;
    nap_data->recv_data = nap_recv_data;
}